

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68010_movec(m68k_info *info)

{
  uint uVar1;
  cs_m68k *pcVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if ((info->type & 0x1e) != 0) {
    uVar1 = read_imm_16(info);
    fVar4 = 0.0;
    pcVar2 = build_init_op(info,0x11b,2,0);
    switch(uVar1 & 0xfff) {
    case 0:
      fVar4 = 3.92364e-44;
      break;
    case 1:
      fVar4 = 4.06377e-44;
      break;
    case 2:
      fVar4 = 4.48416e-44;
      break;
    case 3:
      fVar4 = 5.04467e-44;
      break;
    case 4:
      fVar4 = 5.1848e-44;
      break;
    case 5:
      fVar4 = 5.32493e-44;
      break;
    case 6:
      fVar4 = 5.46506e-44;
      break;
    case 7:
      fVar4 = 5.60519e-44;
      break;
    default:
      switch(uVar1 & 0xfff) {
      case 0x800:
        fVar4 = 4.2039e-44;
        break;
      case 0x801:
        fVar4 = 4.34403e-44;
        break;
      case 0x802:
        fVar4 = 4.62428e-44;
        break;
      case 0x803:
        fVar4 = 4.76441e-44;
        break;
      case 0x804:
        fVar4 = 4.90454e-44;
        break;
      case 0x805:
        fVar4 = 5.74532e-44;
        break;
      case 0x806:
        fVar4 = 5.88545e-44;
        break;
      case 0x807:
        fVar4 = 6.02558e-44;
      }
    }
    fVar3 = (float)((uVar1 >> 0xc & 7) + 1 + (uint)(0x7fff < uVar1) * 8);
    fVar5 = fVar4;
    if ((info->ir & 2) == 0) {
      fVar5 = fVar3;
      fVar3 = fVar4;
    }
    pcVar2->operands[0].field_0.reg = (m68k_reg)fVar3;
    pcVar2->operands[1].field_0.simm = fVar5;
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68010_movec(m68k_info *info)
{
	uint extension;
	m68k_reg reg;
	cs_m68k* ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;


	LIMIT_CPU_TYPES(info, M68010_PLUS);

	extension = read_imm_16(info);
	reg = M68K_REG_INVALID;

	ext = build_init_op(info, M68K_INS_MOVEC, 2, 0);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	switch (extension & 0xfff) {
		case 0x000: reg = M68K_REG_SFC; break;
		case 0x001: reg = M68K_REG_DFC; break;
		case 0x800: reg = M68K_REG_USP; break;
		case 0x801: reg = M68K_REG_VBR; break;
		case 0x002: reg = M68K_REG_CACR; break;
		case 0x802: reg = M68K_REG_CAAR; break;
		case 0x803: reg = M68K_REG_MSP; break;
		case 0x804: reg = M68K_REG_ISP; break;
		case 0x003: reg = M68K_REG_TC; break;
		case 0x004: reg = M68K_REG_ITT0; break;
		case 0x005: reg = M68K_REG_ITT1; break;
		case 0x006: reg = M68K_REG_DTT0; break;
		case 0x007: reg = M68K_REG_DTT1; break;
		case 0x805: reg = M68K_REG_MMUSR; break;
		case 0x806: reg = M68K_REG_URP; break;
		case 0x807: reg = M68K_REG_SRP; break;
	}

	if (BIT_1(info->ir)) {
		op0->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
		op1->reg = reg;
	} else {
		op0->reg = reg;
		op1->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
	}
}